

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

int gej_xyz_equals_gej(secp256k1_gej *a,secp256k1_gej *b)

{
  secp256k1_fe *psVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_EAX;
  uint32_t uVar6;
  long lVar7;
  uint count;
  uint uVar8;
  ulong uVar9;
  secp256k1_ge *psVar10;
  ulong uVar11;
  secp256k1_ge *a_00;
  ulong uVar12;
  secp256k1_ge *psVar13;
  ulong uVar14;
  secp256k1_ge *r;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  secp256k1_fe *r_00;
  bool bVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  secp256k1_gej b2;
  secp256k1_gej a2;
  undefined1 auStack_450 [56];
  ulong uStack_418;
  ulong uStack_410;
  ulong uStack_408;
  ulong uStack_400;
  ulong uStack_3f8;
  secp256k1_ge sStack_3f0;
  secp256k1_ge *psStack_388;
  undefined1 auStack_380 [56];
  uint64_t uStack_348;
  uint64_t uStack_340;
  uint64_t uStack_338;
  uint64_t uStack_330;
  int iStack_328;
  secp256k1_ge sStack_310;
  secp256k1_ge sStack_2a0;
  secp256k1_gej sStack_230;
  secp256k1_fe *psStack_198;
  secp256k1_ge *psStack_190;
  secp256k1_fe *psStack_188;
  secp256k1_ge *psStack_180;
  secp256k1_fe *psStack_178;
  secp256k1_ge *psStack_170;
  undefined1 local_160 [92];
  int local_104;
  secp256k1_ge local_100;
  secp256k1_fe local_98;
  secp256k1_fe local_68;
  
  bVar19 = 0;
  iVar5 = 0;
  if ((a->infinity != b->infinity) || (iVar5 = 1, a->infinity != 0)) {
    return iVar5;
  }
  psVar1 = (secp256k1_fe *)(local_100.y.n + 1);
  psStack_170 = (secp256k1_ge *)0x14ec14;
  memcpy(psVar1,a,0x98);
  psVar10 = (secp256k1_ge *)local_160;
  psStack_170 = (secp256k1_ge *)0x14ec29;
  memcpy(psVar10,b,0x98);
  psStack_170 = (secp256k1_ge *)0x14ec31;
  secp256k1_fe_normalize(psVar1);
  r_00 = &local_98;
  psStack_170 = (secp256k1_ge *)0x14ec41;
  secp256k1_fe_normalize(r_00);
  psStack_170 = (secp256k1_ge *)0x14ec51;
  secp256k1_fe_normalize(&local_68);
  psStack_170 = (secp256k1_ge *)0x14ec59;
  secp256k1_fe_normalize((secp256k1_fe *)psVar10);
  psVar13 = (secp256k1_ge *)(local_160 + 0x30);
  psStack_170 = (secp256k1_ge *)0x14ec66;
  secp256k1_fe_normalize((secp256k1_fe *)psVar13);
  psStack_170 = (secp256k1_ge *)0x14ec73;
  secp256k1_fe_normalize(&local_100.x);
  psStack_170 = (secp256k1_ge *)0x14ec7b;
  secp256k1_fe_verify(psVar1);
  psStack_170 = (secp256k1_ge *)0x14ec83;
  a_00 = psVar10;
  secp256k1_fe_verify((secp256k1_fe *)psVar10);
  if (local_100._100_4_ == 0) {
    psStack_170 = (secp256k1_ge *)0x14ed88;
    gej_xyz_equals_gej_cold_6();
LAB_0014ed88:
    psStack_170 = (secp256k1_ge *)0x14ed8d;
    gej_xyz_equals_gej_cold_5();
LAB_0014ed8d:
    psStack_170 = (secp256k1_ge *)0x14ed92;
    gej_xyz_equals_gej_cold_4();
LAB_0014ed92:
    psStack_170 = (secp256k1_ge *)0x14ed97;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (local_160._44_4_ == 0) goto LAB_0014ed88;
    uVar4 = 4;
    do {
      uVar12 = *(ulong *)(local_160 + (ulong)uVar4 * 8);
      uVar9 = local_100.y.n[(ulong)uVar4 + 1];
      if (uVar9 >= uVar12 && uVar9 != uVar12) {
        psVar10 = (secp256k1_ge *)0x1;
        goto LAB_0014ecc5;
      }
      if (uVar9 < uVar12) {
        psVar10 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ecc5;
      }
      bVar18 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar18);
    psVar10 = (secp256k1_ge *)0x0;
LAB_0014ecc5:
    psStack_170 = (secp256k1_ge *)0x14eccd;
    secp256k1_fe_verify(r_00);
    psStack_170 = (secp256k1_ge *)0x14ecd5;
    a_00 = psVar13;
    secp256k1_fe_verify((secp256k1_fe *)psVar13);
    if (local_98.normalized == 0) goto LAB_0014ed8d;
    if (local_104 == 0) goto LAB_0014ed92;
    uVar4 = 4;
    do {
      uVar12 = *(ulong *)(local_160 + (ulong)uVar4 * 8 + 0x30);
      uVar9 = local_98.n[uVar4];
      if (uVar9 >= uVar12 && uVar9 != uVar12) {
        r_00 = (secp256k1_fe *)0x1;
        goto LAB_0014ed1e;
      }
      if (uVar9 < uVar12) {
        r_00 = (secp256k1_fe *)0xffffffff;
        goto LAB_0014ed1e;
      }
      bVar18 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar18);
    r_00 = (secp256k1_fe *)0x0;
LAB_0014ed1e:
    psStack_170 = (secp256k1_ge *)0x14ed26;
    secp256k1_fe_verify(&local_68);
    psStack_170 = (secp256k1_ge *)0x14ed2e;
    a_00 = &local_100;
    secp256k1_fe_verify(&local_100.x);
    if (local_68.normalized != 0) {
      if (local_100.x.normalized != 0) {
        uVar4 = 4;
        do {
          if (local_68.n[uVar4] != local_100.x.n[uVar4]) {
            bVar18 = true;
            goto LAB_0014ed69;
          }
          bVar18 = uVar4 != 0;
          uVar4 = uVar4 - 1;
        } while (bVar18);
        bVar18 = false;
LAB_0014ed69:
        return (uint)(((int)r_00 == 0 && (int)psVar10 == 0) && !bVar18);
      }
      goto LAB_0014ed9c;
    }
  }
  psStack_170 = (secp256k1_ge *)0x14ed9c;
  gej_xyz_equals_gej_cold_2();
LAB_0014ed9c:
  psStack_170 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r = &sStack_310;
  psStack_388 = a_00;
  psStack_198 = &local_68;
  psStack_190 = psVar13;
  psStack_188 = psVar1;
  psStack_180 = &local_100;
  psStack_178 = r_00;
  psStack_170 = psVar10;
  secp256k1_ge_from_storage(r,(secp256k1_ge_storage *)a_00);
  iVar5 = secp256k1_ge_is_valid_var(r);
  if (iVar5 != 0) {
    secp256k1_gej_set_ge(&sStack_230,&sStack_310);
    secp256k1_gej_double_var(&sStack_230,&sStack_230,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_380,&sStack_230);
    sStack_3f0._96_8_ = 0x40;
    while( true ) {
      psVar13 = (secp256k1_ge *)(auStack_380 + 0x30);
      secp256k1_fe_verify(&sStack_310.x);
      psVar10 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_310.x,1);
      auStack_450._0_8_ = 0x3ffffbfffff0bc - sStack_310.x.n[0];
      auStack_450._8_8_ = 0x3ffffffffffffc - sStack_310.x.n[1];
      auStack_450._16_8_ = 0x3ffffffffffffc - sStack_310.x.n[2];
      auStack_450._24_8_ = 0x3ffffffffffffc - sStack_310.x.n[3];
      auStack_450._32_8_ = 0x3fffffffffffc - sStack_310.x.n[4];
      auStack_450._40_4_ = 2;
      auStack_450._44_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_450);
      secp256k1_fe_verify((secp256k1_fe *)auStack_450);
      r = (secp256k1_ge *)auStack_380;
      secp256k1_fe_verify((secp256k1_fe *)r);
      if (0x20 < (int)(auStack_380._40_4_ + auStack_450._40_4_)) break;
      auStack_450._0_8_ = auStack_450._0_8_ + auStack_380._0_8_;
      auStack_450._8_8_ = auStack_450._8_8_ + auStack_380._8_8_;
      auStack_450._16_8_ = auStack_450._16_8_ + auStack_380._16_8_;
      auStack_450._24_8_ = auStack_450._24_8_ + auStack_380._24_8_;
      auStack_450._32_8_ = auStack_450._32_8_ + auStack_380._32_8_;
      auStack_450._44_4_ = 0;
      auStack_450._40_4_ = auStack_380._40_4_ + auStack_450._40_4_;
      secp256k1_fe_verify((secp256k1_fe *)auStack_450);
      secp256k1_fe_verify((secp256k1_fe *)auStack_450);
      auStack_450._0_8_ = ((ulong)auStack_450._32_8_ >> 0x30) * 0x1000003d1 + auStack_450._0_8_;
      auStack_450._8_8_ = ((ulong)auStack_450._0_8_ >> 0x34) + auStack_450._8_8_;
      auStack_450._16_8_ = ((ulong)auStack_450._8_8_ >> 0x34) + auStack_450._16_8_;
      uVar12 = ((ulong)auStack_450._16_8_ >> 0x34) + auStack_450._24_8_;
      auStack_450._24_8_ = uVar12 & 0xfffffffffffff;
      auStack_450._32_8_ = (uVar12 >> 0x34) + (auStack_450._32_8_ & 0xffffffffffff);
      auStack_450._16_8_ = auStack_450._16_8_ & 0xfffffffffffff;
      auStack_450._8_8_ = auStack_450._8_8_ & 0xfffffffffffff;
      auStack_450._0_8_ = auStack_450._0_8_ & 0xfffffffffffff;
      auStack_450._40_4_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)auStack_450);
      secp256k1_fe_verify(&sStack_310.y);
      psVar10 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_310.y,1);
      auStack_450._48_8_ = 0x3ffffbfffff0bc - sStack_310.y.n[0];
      uStack_418 = 0x3ffffffffffffc - sStack_310.y.n[1];
      uStack_410 = 0x3ffffffffffffc - sStack_310.y.n[2];
      uStack_408 = 0x3ffffffffffffc - sStack_310.y.n[3];
      uStack_400 = 0x3fffffffffffc - sStack_310.y.n[4];
      uStack_3f8._0_4_ = 2;
      uStack_3f8._4_4_ = 0;
      psVar1 = (secp256k1_fe *)(auStack_450 + 0x30);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)psVar13);
      r = psVar13;
      if (0x20 < iStack_328 + (int)uStack_3f8) goto LAB_0014f663;
      auStack_450._48_8_ = auStack_450._48_8_ + auStack_380._48_8_;
      uStack_418 = uStack_418 + uStack_348;
      uStack_410 = uStack_410 + uStack_340;
      uStack_408 = uStack_408 + uStack_338;
      uStack_400 = uStack_400 + uStack_330;
      uStack_3f8 = (ulong)(uint)(iStack_328 + (int)uStack_3f8);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify(psVar1);
      auStack_450._48_8_ = (uStack_400 >> 0x30) * 0x1000003d1 + auStack_450._48_8_;
      uStack_418 = ((ulong)auStack_450._48_8_ >> 0x34) + uStack_418;
      uStack_410 = (uStack_418 >> 0x34) + uStack_410;
      uVar12 = (uStack_410 >> 0x34) + uStack_408;
      uStack_408 = uVar12 & 0xfffffffffffff;
      uStack_400 = (uVar12 >> 0x34) + (uStack_400 & 0xffffffffffff);
      uStack_410 = uStack_410 & 0xfffffffffffff;
      uStack_418 = uStack_418 & 0xfffffffffffff;
      auStack_450._48_8_ = auStack_450._48_8_ & 0xfffffffffffff;
      uStack_3f8 = CONCAT44(uStack_3f8._4_4_,1);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)auStack_450);
      uVar12 = ((ulong)auStack_450._32_8_ >> 0x30) * 0x1000003d1 + auStack_450._0_8_;
      if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
        uVar9 = (uVar12 >> 0x34) + auStack_450._8_8_;
        uVar11 = (uVar9 >> 0x34) + auStack_450._16_8_;
        uVar14 = (uVar11 >> 0x34) + auStack_450._24_8_;
        uVar15 = (uVar14 >> 0x34) + (auStack_450._32_8_ & 0xffffffffffff);
        if ((((uVar9 | uVar12 | uVar11 | uVar14) & 0xfffffffffffff) != 0 || uVar15 != 0) &&
           ((uVar12 + 0x1000003d0 & uVar9 & uVar11 & uVar14 & (uVar15 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014f267;
        secp256k1_fe_verify(psVar1);
        uVar12 = (uStack_400 >> 0x30) * 0x1000003d1 + auStack_450._48_8_;
        if (((uVar12 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar12 & 0xfffffffffffff) != 0))
        goto LAB_0014f267;
        uVar9 = (uVar12 >> 0x34) + uStack_418;
        a_00 = (secp256k1_ge *)((uVar9 >> 0x34) + uStack_410);
        r = (secp256k1_ge *)(((ulong)a_00 >> 0x34) + uStack_408);
        uVar11 = ((ulong)r >> 0x34) + (uStack_400 & 0xffffffffffff);
        if ((((uVar9 | uVar12 | (ulong)a_00 | (ulong)r) & 0xfffffffffffff) != 0 || uVar11 != 0) &&
           ((uVar12 + 0x1000003d0 & uVar9 & (ulong)a_00 & (ulong)r & (uVar11 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014f267;
        goto LAB_0014f681;
      }
LAB_0014f267:
      psVar10 = (secp256k1_ge *)((long)(psStack_388->x).n + sStack_3f0._96_8_);
      secp256k1_ge_from_storage(&sStack_2a0,(secp256k1_ge_storage *)psVar10);
      r = &sStack_2a0;
      iVar5 = secp256k1_ge_is_valid_var(&sStack_2a0);
      if (iVar5 == 0) goto LAB_0014f668;
      secp256k1_fe_verify(&sStack_2a0.x);
      psVar10 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_2a0.x,1);
      sStack_3f0.y.n[0] = 0x3ffffbfffff0bc - sStack_2a0.x.n[0];
      sStack_3f0.y.n[1] = 0x3ffffffffffffc - sStack_2a0.x.n[1];
      sStack_3f0.y.n[2] = 0x3ffffffffffffc - sStack_2a0.x.n[2];
      sStack_3f0.y.n[3] = 0x3ffffffffffffc - sStack_2a0.x.n[3];
      sStack_3f0.y.n[4] = 0x3fffffffffffc - sStack_2a0.x.n[4];
      sStack_3f0.y.magnitude = 2;
      sStack_3f0.y.normalized = 0;
      psVar1 = &sStack_3f0.y;
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify(psVar1);
      r = (secp256k1_ge *)auStack_380;
      secp256k1_fe_verify((secp256k1_fe *)r);
      if (0x20 < auStack_380._40_4_ + sStack_3f0.y.magnitude) goto LAB_0014f66d;
      sStack_3f0.y.n[0] = sStack_3f0.y.n[0] + auStack_380._0_8_;
      sStack_3f0.y.n[1] = sStack_3f0.y.n[1] + auStack_380._8_8_;
      sStack_3f0.y.n[2] = sStack_3f0.y.n[2] + auStack_380._16_8_;
      sStack_3f0.y.n[3] = sStack_3f0.y.n[3] + auStack_380._24_8_;
      sStack_3f0.y.n[4] = sStack_3f0.y.n[4] + auStack_380._32_8_;
      sStack_3f0.y.normalized = 0;
      sStack_3f0.y.magnitude = auStack_380._40_4_ + sStack_3f0.y.magnitude;
      secp256k1_fe_verify(psVar1);
      sStack_3f0.x.n[4] = sStack_2a0.y.n[4];
      sStack_3f0.x.magnitude = sStack_2a0.y.magnitude;
      sStack_3f0.x.normalized = sStack_2a0.y.normalized;
      sStack_3f0.x.n[2] = sStack_2a0.y.n[2];
      sStack_3f0.x.n[3] = sStack_2a0.y.n[3];
      sStack_3f0.x.n[0] = sStack_2a0.y.n[0];
      sStack_3f0.x.n[1] = sStack_2a0.y.n[1];
      secp256k1_fe_verify(&sStack_3f0.x);
      r = (secp256k1_ge *)(auStack_380 + 0x30);
      secp256k1_fe_verify((secp256k1_fe *)r);
      if (0x20 < iStack_328 + sStack_3f0.x.magnitude) goto LAB_0014f672;
      sStack_3f0.x.n[0] = sStack_3f0.x.n[0] + auStack_380._48_8_;
      sStack_3f0.x.n[1] = sStack_3f0.x.n[1] + uStack_348;
      sStack_3f0.x.n[2] = sStack_3f0.x.n[2] + uStack_340;
      sStack_3f0.x.n[3] = sStack_3f0.x.n[3] + uStack_338;
      sStack_3f0.x.n[4] = sStack_3f0.x.n[4] + uStack_330;
      sStack_3f0.x.normalized = 0;
      sStack_3f0.x.magnitude = iStack_328 + sStack_3f0.x.magnitude;
      secp256k1_fe_verify(&sStack_3f0.x);
      secp256k1_fe_verify(psVar1);
      uVar12 = (sStack_3f0.y.n[4] >> 0x30) * 0x1000003d1 + sStack_3f0.y.n[0];
      if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
        uVar9 = (uVar12 >> 0x34) + sStack_3f0.y.n[1];
        uVar11 = (uVar9 >> 0x34) + sStack_3f0.y.n[2];
        uVar14 = (uVar11 >> 0x34) + sStack_3f0.y.n[3];
        uVar15 = (uVar14 >> 0x34) + (sStack_3f0.y.n[4] & 0xffffffffffff);
        if ((((uVar9 | uVar12 | uVar11 | uVar14) & 0xfffffffffffff) != 0 || uVar15 != 0) &&
           ((uVar12 + 0x1000003d0 & uVar9 & uVar11 & uVar14 & (uVar15 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014f5b4;
        secp256k1_fe_verify(&sStack_3f0.x);
        uVar12 = (sStack_3f0.x.n[4] >> 0x30) * 0x1000003d1 + sStack_3f0.x.n[0];
        if (((uVar12 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar12 & 0xfffffffffffff) != 0))
        goto LAB_0014f5b4;
        uVar9 = (uVar12 >> 0x34) + sStack_3f0.x.n[1];
        a_00 = (secp256k1_ge *)((uVar9 >> 0x34) + sStack_3f0.x.n[2]);
        r = (secp256k1_ge *)(((ulong)a_00 >> 0x34) + sStack_3f0.x.n[3]);
        uVar11 = ((ulong)r >> 0x34) + (sStack_3f0.x.n[4] & 0xffffffffffff);
        if ((((uVar9 | uVar12 | (ulong)a_00 | (ulong)r) & 0xfffffffffffff) != 0 || uVar11 != 0) &&
           ((uVar12 + 0x1000003d0 & uVar9 & (ulong)a_00 & (ulong)r & (uVar11 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014f5b4;
        goto LAB_0014f686;
      }
LAB_0014f5b4:
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)auStack_450,psVar1);
      psVar10 = (secp256k1_ge *)(auStack_450 + 0x30);
      if ((iVar5 != 0) &&
         (a_00 = &sStack_3f0, r = psVar10,
         iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar10,&sStack_3f0.x), iVar5 != 0))
      goto LAB_0014f67c;
      secp256k1_fe_mul((secp256k1_fe *)auStack_450,(secp256k1_fe *)auStack_450,&sStack_3f0.x);
      secp256k1_fe_mul((secp256k1_fe *)psVar10,(secp256k1_fe *)psVar10,&sStack_3f0.y);
      r = (secp256k1_ge *)auStack_450;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)auStack_450,(secp256k1_fe *)psVar10);
      if (iVar5 == 0) goto LAB_0014f677;
      psVar10 = &sStack_2a0;
      psVar13 = &sStack_310;
      for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
        (psVar13->x).n[0] = (psVar10->x).n[0];
        psVar10 = (secp256k1_ge *)((long)psVar10 + ((ulong)bVar19 * -2 + 1) * 8);
        psVar13 = (secp256k1_ge *)((long)psVar13 + ((ulong)bVar19 * -2 + 1) * 8);
      }
      sStack_3f0._96_8_ = sStack_3f0._96_8_ + 0x40;
      if (sStack_3f0._96_8_ == 0x80000) {
        return 0x80000;
      }
    }
    test_pre_g_table_cold_9();
LAB_0014f663:
    test_pre_g_table_cold_8();
LAB_0014f668:
    test_pre_g_table_cold_7();
LAB_0014f66d:
    test_pre_g_table_cold_6();
LAB_0014f672:
    test_pre_g_table_cold_5();
LAB_0014f677:
    test_pre_g_table_cold_4();
    a_00 = psVar10;
LAB_0014f67c:
    test_pre_g_table_cold_3();
LAB_0014f681:
    test_pre_g_table_cold_1();
LAB_0014f686:
    test_pre_g_table_cold_2();
  }
  test_pre_g_table_cold_10();
  secp256k1_scalar_verify((secp256k1_scalar *)a_00);
  auVar20._0_4_ = -(uint)((int)(a_00->x).n[2] == 0 && (int)(a_00->x).n[0] == 0);
  auVar20._4_4_ =
       -(uint)(*(int *)((long)(a_00->x).n + 0x14) == 0 && *(int *)((long)(a_00->x).n + 4) == 0);
  auVar20._8_4_ = -(uint)((int)(a_00->x).n[3] == 0 && (int)(a_00->x).n[1] == 0);
  auVar20._12_4_ =
       -(uint)(*(int *)((long)(a_00->x).n + 0x1c) == 0 && *(int *)((long)(a_00->x).n + 0xc) == 0);
  iVar5 = movmskps(extraout_EAX,auVar20);
  if (iVar5 == 0xf) {
    uVar4 = 0;
    if (-1 < (int)(0x7f / (long)(int)count)) {
      uVar4 = 0;
      memset(r,0,(0x7f / (long)(int)count & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    secp256k1_scalar_verify((secp256k1_scalar *)a_00);
    uVar4 = ~(uint)(a_00->x).n[0] & 1;
    uVar6 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,0,count);
    *(uint32_t *)(r->x).n = uVar6 + uVar4;
    iVar5 = (int)(0x7f / (long)(int)count);
    uVar16 = iVar5 * count;
    uVar17 = 0x80 - uVar16;
    uVar12 = 0x7f / (long)(int)count & 0xffffffff;
    if (0 < iVar5) {
      lVar7 = 0;
      uVar9 = uVar12;
      do {
        uVar8 = count;
        if (lVar7 == 0) {
          uVar8 = uVar17;
        }
        uVar6 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,uVar16,uVar8);
        if (uVar6 != 0) goto LAB_0014f765;
        *(undefined4 *)((long)(r->x).n + uVar9 * 4) = 0;
        uVar16 = uVar16 - count;
        lVar7 = lVar7 + 1;
        bVar18 = 1 < (long)uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar18);
      uVar9 = 0;
LAB_0014f765:
      iVar5 = (int)uVar9;
    }
    if (0 < iVar5) {
      uVar9 = 1;
      uVar16 = count;
      do {
        uVar8 = count;
        if (uVar12 == uVar9) {
          uVar8 = uVar17;
        }
        uVar6 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,uVar16,uVar8);
        if ((uVar6 & 1) == 0) {
          piVar2 = (int *)((long)(r->x).n + uVar9 * 4 + -4);
          *piVar2 = *piVar2 + (-1 << ((byte)count & 0x1f));
          uVar6 = uVar6 | 1;
        }
        *(uint32_t *)((long)(r->x).n + uVar9 * 4) = uVar6;
        if ((1 < uVar9) &&
           (((iVar3 = *(int *)((long)(r->x).n + uVar9 * 4 + -4), iVar3 == 1 &&
             (*(int *)((long)(r->x).n + uVar9 * 4 + -8) < 0)) ||
            ((iVar3 == -1 && (0 < *(int *)((long)(r->x).n + uVar9 * 4 + -8))))))) {
          piVar2 = (int *)((long)(r->x).n + uVar9 * 4 + -8);
          *piVar2 = *piVar2 + ((uint)(iVar3 == 1) * 2 + -1 << ((byte)count & 0x1f));
          *(undefined4 *)((long)(r->x).n + uVar9 * 4 + -4) = 0;
        }
        uVar9 = uVar9 + 1;
        uVar16 = uVar16 + count;
      } while (iVar5 + 1 != uVar9);
    }
  }
  return uVar4;
}

Assistant:

static int gej_xyz_equals_gej(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej a2;
    secp256k1_gej b2;
    int ret = 1;
    ret &= a->infinity == b->infinity;
    if (ret && !a->infinity) {
        a2 = *a;
        b2 = *b;
        secp256k1_fe_normalize(&a2.x);
        secp256k1_fe_normalize(&a2.y);
        secp256k1_fe_normalize(&a2.z);
        secp256k1_fe_normalize(&b2.x);
        secp256k1_fe_normalize(&b2.y);
        secp256k1_fe_normalize(&b2.z);
        ret &= secp256k1_fe_cmp_var(&a2.x, &b2.x) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.y, &b2.y) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.z, &b2.z) == 0;
    }
    return ret;
}